

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraKateGenerator::WriteTargets
          (cmExtraKateGenerator *this,cmLocalGenerator *lg,cmGeneratedFileStream *fout)

{
  cmMakefile *pcVar1;
  cmGlobalGenerator *pcVar2;
  pointer puVar3;
  cmLocalGenerator *this_00;
  pointer puVar4;
  __type _Var5;
  bool bVar6;
  TargetType TVar7;
  string *make;
  string *makeArgs;
  string *path;
  ostream *poVar8;
  string *psVar9;
  cmValue cVar10;
  char *pcVar11;
  pointer puVar12;
  pointer puVar13;
  string_view str;
  string_view str_00;
  string_view str_01;
  allocator<char> local_a9;
  string currentDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objectFileTargets;
  
  pcVar1 = lg->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&currentDir,"CMAKE_MAKE_PROGRAM",(allocator<char> *)&objectFileTargets);
  make = cmMakefile::GetRequiredDefinition(pcVar1,&currentDir);
  std::__cxx11::string::~string((string *)&currentDir);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&currentDir,"CMAKE_KATE_MAKE_ARGUMENTS",(allocator<char> *)&objectFileTargets
            );
  makeArgs = cmMakefile::GetSafeDefinition(pcVar1,&currentDir);
  std::__cxx11::string::~string((string *)&currentDir);
  path = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(lg);
  cmMakefile::GetGeneratorConfigs_abi_cxx11_(&configs,pcVar1,IncludeEmptyConfig);
  poVar8 = std::operator<<((ostream *)fout,"\t\"build\": {\n\t\t\"directory\": \"");
  poVar8 = std::operator<<(poVar8,(string *)path);
  std::operator<<(poVar8,"\",\n\t\t\"default_target\": \"all\",\n\t\t\"clean_target\": \"clean\",\n"
                 );
  poVar8 = std::operator<<((ostream *)fout,"\t\t\"build\": \"");
  poVar8 = std::operator<<(poVar8,(string *)make);
  poVar8 = std::operator<<(poVar8," -C \\\"");
  poVar8 = std::operator<<(poVar8,(string *)path);
  poVar8 = std::operator<<(poVar8,"\\\" ");
  poVar8 = std::operator<<(poVar8,(string *)makeArgs);
  poVar8 = std::operator<<(poVar8," ");
  std::operator<<(poVar8,"all\",\n");
  poVar8 = std::operator<<((ostream *)fout,"\t\t\"clean\": \"");
  poVar8 = std::operator<<(poVar8,(string *)make);
  poVar8 = std::operator<<(poVar8," -C \\\"");
  poVar8 = std::operator<<(poVar8,(string *)path);
  poVar8 = std::operator<<(poVar8,"\\\" ");
  poVar8 = std::operator<<(poVar8,(string *)makeArgs);
  poVar8 = std::operator<<(poVar8," ");
  std::operator<<(poVar8,"clean\",\n");
  poVar8 = std::operator<<((ostream *)fout,"\t\t\"quick\": \"");
  poVar8 = std::operator<<(poVar8,(string *)make);
  poVar8 = std::operator<<(poVar8," -C \\\"");
  poVar8 = std::operator<<(poVar8,(string *)path);
  poVar8 = std::operator<<(poVar8,"\\\" ");
  poVar8 = std::operator<<(poVar8,(string *)makeArgs);
  poVar8 = std::operator<<(poVar8," ");
  std::operator<<(poVar8,"install\",\n");
  std::operator<<((ostream *)fout,"\t\t\"targets\":[\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&currentDir,"all",(allocator<char> *)&objectFileTargets);
  AppendTarget(this,fout,&currentDir,&configs,make,makeArgs,path,path);
  std::__cxx11::string::~string((string *)&currentDir);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&currentDir,"clean",(allocator<char> *)&objectFileTargets);
  AppendTarget(this,fout,&currentDir,&configs,make,makeArgs,path,path);
  std::__cxx11::string::~string((string *)&currentDir);
  pcVar2 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  puVar12 = (pcVar2->LocalGenerators).
            super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (pcVar2->LocalGenerators).
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar12 == puVar3) {
      std::operator<<((ostream *)fout,"\t] }\n");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&configs);
      return;
    }
    this_00 = (puVar12->_M_t).
              super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
              super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
              super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
    psVar9 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this_00);
    std::__cxx11::string::string((string *)&currentDir,(string *)psVar9);
    psVar9 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                       ((puVar12->_M_t).
                        super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                        .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl);
    _Var5 = std::operator==(&currentDir,psVar9);
    puVar4 = *(pointer *)
              ((long)&(this_00->GeneratorTargets).
                      super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
              + 8);
    for (puVar13 = (this_00->GeneratorTargets).
                   super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar13 != puVar4;
        puVar13 = puVar13 + 1) {
      psVar9 = cmGeneratorTarget::GetName_abi_cxx11_
                         ((puVar13->_M_t).
                          super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                          .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
      TVar7 = cmGeneratorTarget::GetType
                        ((puVar13->_M_t).
                         super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                         .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
      if (TVar7 < UTILITY) {
        AppendTarget(this,fout,psVar9,&configs,make,makeArgs,&currentDir,path);
        if (this->UseNinja == false) {
          cmStrCat<std::__cxx11::string_const&,char_const(&)[6]>
                    ((string *)&objectFileTargets,psVar9,(char (*) [6])0x711c01);
          AppendTarget(this,fout,(string *)&objectFileTargets,&configs,make,makeArgs,&currentDir,
                       path);
          std::__cxx11::string::~string((string *)&objectFileTargets);
        }
      }
      else if (TVar7 == UTILITY) {
        str._M_str = (psVar9->_M_dataplus)._M_p;
        str._M_len = psVar9->_M_string_length;
        bVar6 = cmHasLiteralPrefix<8ul>(str,(char (*) [8])"Nightly");
        if (bVar6) {
          bVar6 = std::operator!=(psVar9,"Nightly");
          if (bVar6) goto LAB_003eeac5;
        }
        str_00._M_str = (psVar9->_M_dataplus)._M_p;
        str_00._M_len = psVar9->_M_string_length;
        bVar6 = cmHasLiteralPrefix<11ul>(str_00,(char (*) [11])"Continuous");
        if (bVar6) {
          bVar6 = std::operator!=(psVar9,"Continuous");
          if (bVar6) goto LAB_003eeac5;
        }
        str_01._M_str = (psVar9->_M_dataplus)._M_p;
        str_01._M_len = psVar9->_M_string_length;
        bVar6 = cmHasLiteralPrefix<13ul>(str_01,(char (*) [13])"Experimental");
        if (bVar6) {
          bVar6 = std::operator!=(psVar9,"Experimental");
          if (bVar6) goto LAB_003eeac5;
        }
        AppendTarget(this,fout,psVar9,&configs,make,makeArgs,&currentDir,path);
      }
      else if ((TVar7 == GLOBAL_TARGET) && (_Var5)) {
        bVar6 = std::operator==(psVar9,"edit_cache");
        if (bVar6) {
          pcVar1 = ((puVar12->_M_t).
                    super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                    .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->Makefile;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&objectFileTargets,"CMAKE_EDIT_COMMAND",&local_a9);
          cVar10 = cmMakefile::GetDefinition(pcVar1,(string *)&objectFileTargets);
          std::__cxx11::string::~string((string *)&objectFileTargets);
          if (cVar10.Value != (string *)0x0) {
            pcVar11 = strstr(((cVar10.Value)->_M_dataplus)._M_p,"ccmake");
            if (pcVar11 == (char *)0x0) goto LAB_003ee9f0;
          }
        }
        else {
LAB_003ee9f0:
          AppendTarget(this,fout,psVar9,&configs,make,makeArgs,&currentDir,path);
        }
      }
LAB_003eeac5:
    }
    objectFileTargets.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    objectFileTargets.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    objectFileTargets.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&objectFileTargets);
    std::__cxx11::string::~string((string *)&currentDir);
    puVar12 = puVar12 + 1;
  } while( true );
}

Assistant:

void cmExtraKateGenerator::WriteTargets(const cmLocalGenerator& lg,
                                        cmGeneratedFileStream& fout) const
{
  cmMakefile const* mf = lg.GetMakefile();
  const std::string& make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  const std::string& makeArgs =
    mf->GetSafeDefinition("CMAKE_KATE_MAKE_ARGUMENTS");
  std::string const& homeOutputDir = lg.GetBinaryDirectory();
  const auto configs = mf->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  /* clang-format off */
  fout <<
  "\t\"build\": {\n"
  "\t\t\"directory\": \"" << homeOutputDir << "\",\n"
  "\t\t\"default_target\": \"all\",\n"
  "\t\t\"clean_target\": \"clean\",\n";
  /* clang-format on */

  // build, clean and quick are for the build plugin kate <= 4.12:
  fout << "\t\t\"build\": \"" << make << " -C \\\"" << homeOutputDir << "\\\" "
       << makeArgs << " "
       << "all\",\n";
  fout << "\t\t\"clean\": \"" << make << " -C \\\"" << homeOutputDir << "\\\" "
       << makeArgs << " "
       << "clean\",\n";
  fout << "\t\t\"quick\": \"" << make << " -C \\\"" << homeOutputDir << "\\\" "
       << makeArgs << " "
       << "install\",\n";

  // this is for kate >= 4.13:
  fout << "\t\t\"targets\":[\n";

  this->AppendTarget(fout, "all", configs, make, makeArgs, homeOutputDir,
                     homeOutputDir);
  this->AppendTarget(fout, "clean", configs, make, makeArgs, homeOutputDir,
                     homeOutputDir);

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (const auto& localGen : this->GlobalGenerator->GetLocalGenerators()) {
    const auto& targets = localGen->GetGeneratorTargets();
    const std::string currentDir = localGen->GetCurrentBinaryDirectory();
    bool topLevel = (currentDir == localGen->GetBinaryDirectory());

    for (const auto& target : targets) {
      std::string const& targetName = target->GetName();
      switch (target->GetType()) {
        case cmStateEnums::GLOBAL_TARGET: {
          bool insertTarget = false;
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (topLevel) {
            insertTarget = true;
            // only add the "edit_cache" target if it's not ccmake, because
            // this will not work within the IDE
            if (targetName == "edit_cache") {
              cmValue editCommand =
                localGen->GetMakefile()->GetDefinition("CMAKE_EDIT_COMMAND");
              if (!editCommand ||
                  strstr(editCommand->c_str(), "ccmake") != nullptr) {
                insertTarget = false;
              }
            }
          }
          if (insertTarget) {
            this->AppendTarget(fout, targetName, configs, make, makeArgs,
                               currentDir, homeOutputDir);
          }
        } break;
        case cmStateEnums::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if ((cmHasLiteralPrefix(targetName, "Nightly") &&
               (targetName != "Nightly")) ||
              (cmHasLiteralPrefix(targetName, "Continuous") &&
               (targetName != "Continuous")) ||
              (cmHasLiteralPrefix(targetName, "Experimental") &&
               (targetName != "Experimental"))) {
            break;
          }

          this->AppendTarget(fout, targetName, configs, make, makeArgs,
                             currentDir, homeOutputDir);
          break;
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY: {
          this->AppendTarget(fout, targetName, configs, make, makeArgs,
                             currentDir, homeOutputDir);
          if (!this->UseNinja) {
            std::string fastTarget = cmStrCat(targetName, "/fast");
            this->AppendTarget(fout, fastTarget, configs, make, makeArgs,
                               currentDir, homeOutputDir);
          }

        } break;
        default:
          break;
      }
    }

    // insert rules for compiling, preprocessing and assembling individual
    // files
    std::vector<std::string> objectFileTargets;
    localGen->GetIndividualFileTargets(objectFileTargets);
    for (std::string const& f : objectFileTargets) {
      this->AppendTarget(fout, f, configs, make, makeArgs, currentDir,
                         homeOutputDir);
    }
  }

  fout << "\t] }\n";
}